

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplePursuit.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_69b37::MpPlugIn::reset(MpPlugIn *this)

{
  MpBase **ppMVar1;
  
  MpWanderer::reset(this->wanderer);
  for (ppMVar1 = (this->pBegin)._M_current; ppMVar1 != (this->pEnd)._M_current;
      ppMVar1 = ppMVar1 + 1) {
    MpPursuer::reset((MpPursuer *)*ppMVar1);
  }
  OpenSteer::OpenSteerDemo::camera.smoothNextMove = false;
  OpenSteer::LocalSpaceMixin<OpenSteer::AbstractLocalSpace>::resetLocalSpace
            (&OpenSteer::OpenSteerDemo::camera.super_LocalSpace);
  return;
}

Assistant:

void reset (void)
        {
            // reset wanderer and pursuers
            wanderer->reset ();
            for (iterator i = pBegin; i != pEnd; i++) ((MpPursuer&)(**i)).reset ();

            // immediately jump to default camera position
            OpenSteerDemo::camera.doNotSmoothNextMove ();
            OpenSteerDemo::camera.resetLocalSpace ();
        }